

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

Promise<void> __thiscall capnp::ClientHook::whenResolved(ClientHook *this)

{
  long lVar1;
  SourceLocation location;
  bool bVar2;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  aVar3;
  OwnPromiseNode OVar4;
  void *pvVar5;
  long *in_RSI;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  unaff_R12;
  TransformPromiseNodeBase *this_00;
  OwnPromiseNode intermediate;
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> _promise114;
  undefined *local_70;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  aStack_68;
  undefined8 local_60;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_58;
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> local_50;
  OwnPromiseNode local_40;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_38;
  
  (**(code **)(*in_RSI + 0x18))(&local_70);
  aVar3 = aStack_68;
  bVar2 = local_70._0_1_;
  local_50.isSet = local_70._0_1_;
  if (local_70._0_1_ == true) {
    local_50.field_1 = aStack_68;
    aStack_68 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
                 )0x0;
    unaff_R12 = aVar3;
  }
  kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::~NullableValue
            ((NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *)&local_70);
  if (bVar2 == false) {
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  }
  else {
    lVar1 = *(long *)((long)unaff_R12 + 8);
    if (lVar1 == 0 || (ulong)((long)unaff_R12 - lVar1) < 0x28) {
      pvVar5 = operator_new(0x400);
      this_00 = (TransformPromiseNodeBase *)((long)pvVar5 + 0x3d8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)&local_50.field_1.value,
                 kj::_::
                 SimpleTransformPromiseNode<kj::Own<capnp::ClientHook,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++:115:25)>
                 ::anon_class_1_0_00000001_for_func::operator());
      *(undefined ***)((long)pvVar5 + 0x3d8) = &PTR_destroy_00369368;
      *(void **)((long)pvVar5 + 0x3e0) = pvVar5;
    }
    else {
      *(undefined8 *)((long)unaff_R12 + 8) = 0;
      this_00 = (TransformPromiseNodeBase *)((long)unaff_R12 + -0x28);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)&local_50.field_1.value,
                 kj::_::
                 SimpleTransformPromiseNode<kj::Own<capnp::ClientHook,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++:115:25)>
                 ::anon_class_1_0_00000001_for_func::operator());
      *(undefined ***)((long)unaff_R12 + -0x28) = &PTR_destroy_00369368;
      *(long *)((long)unaff_R12 + -0x20) = lVar1;
    }
    local_70 = &DAT_0028d57f;
    aStack_68 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
                 )&DAT_0028d5de;
    local_60 = 0x4c0000058b;
    location.function = &DAT_0028d5de;
    location.fileName = &DAT_0028d57f;
    location.lineNumber = 0x58b;
    location.columnNumber = 0x4c;
    local_58.ptr = &this_00->super_PromiseNode;
    kj::_::maybeChain<void>(&local_40,(Promise<void> *)&local_58,location);
    OVar4.ptr = local_40.ptr;
    local_40.ptr = (PromiseNode *)0x0;
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_40);
    this->_vptr_ClientHook = (_func_int **)OVar4.ptr;
    local_38.ptr = (PromiseNode *)0x0;
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_38);
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_58);
  }
  kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::~NullableValue
            (&local_50);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> ClientHook::whenResolved() {
  KJ_IF_SOME(promise, whenMoreResolved()) {
    return promise.then([](kj::Own<ClientHook>&& resolution) {
      return resolution->whenResolved();
    });
  } else {
    return kj::READY_NOW;
  }
}